

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_new_promise_capability(JSContext *ctx,JSValue *resolving_funcs,JSValue ctor)

{
  int *piVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  JSValue JVar7;
  JSValue v;
  JSValue JVar8;
  JSValueUnion local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined8 local_40;
  
  local_58.ptr = (void *)(local_58 << 0x20);
  local_50 = 3;
  local_48 = 0;
  local_40 = 3;
  iVar3 = 0;
  JVar7 = JS_NewCFunctionData(ctx,js_promise_executor,2,0,2,(JSValue *)&local_58);
  if ((int)JVar7.tag == 6) {
    uVar5 = (ulong)JVar7.u.ptr & 0xffffffff00000000;
    v = JVar7;
  }
  else {
    _local_58 = JVar7;
    if ((int)ctor.tag == 3) {
      v = js_promise_constructor(ctx,ctor,iVar3,(JSValue *)&local_58);
    }
    else {
      v = JS_CallConstructor(ctx,ctor,1,(JSValue *)&local_58);
      JVar7 = _local_58;
    }
    if ((int)v.tag != 6) {
      if (((int)JVar7.tag == -1) && (*(short *)((long)JVar7.u.ptr + 6) == 0xf)) {
        lVar6 = *(long *)((long)JVar7.u.ptr + 0x30);
      }
      else {
        lVar6 = 0;
      }
      lVar4 = 0;
      do {
        if (lVar4 + 0x10 == 0x30) {
          for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 0x10) {
            piVar1 = *(int **)(lVar6 + 0x10 + lVar4);
            uVar2 = *(undefined8 *)(lVar6 + 0x18 + lVar4);
            if (0xfffffff4 < (uint)uVar2) {
              *piVar1 = *piVar1 + 1;
            }
            *(int **)((long)&resolving_funcs->u + lVar4) = piVar1;
            *(undefined8 *)((long)&resolving_funcs->tag + lVar4) = uVar2;
          }
          JS_FreeValue(ctx,_local_58);
          uVar5 = (ulong)v.u.ptr & 0xffffffff00000000;
          goto LAB_0012a36d;
        }
        JVar7.tag = *(int64_t *)(lVar6 + 0x18 + lVar4);
        JVar7.u.ptr = ((JSValueUnion *)(lVar6 + 0x10 + lVar4))->ptr;
        iVar3 = check_function(ctx,JVar7);
        lVar4 = lVar4 + 0x10;
        JVar7 = _local_58;
      } while (iVar3 == 0);
    }
    JS_FreeValue(ctx,JVar7);
    JS_FreeValue(ctx,v);
    v = (JSValue)(ZEXT816(6) << 0x40);
    uVar5 = 0;
  }
LAB_0012a36d:
  JVar8.u.ptr = (void *)((ulong)v.u.ptr & 0xffffffff | uVar5);
  JVar8.tag = v.tag;
  return JVar8;
}

Assistant:

static JSValue js_new_promise_capability(JSContext *ctx,
                                         JSValue *resolving_funcs,
                                         JSValueConst ctor)
{
    JSValue executor, result_promise;
    JSCFunctionDataRecord *s;
    int i;

    executor = js_promise_executor_new(ctx);
    if (JS_IsException(executor))
        return executor;

    if (JS_IsUndefined(ctor)) {
        result_promise = js_promise_constructor(ctx, ctor, 1,
                                                (JSValueConst *)&executor);
    } else {
        result_promise = JS_CallConstructor(ctx, ctor, 1,
                                            (JSValueConst *)&executor);
    }
    if (JS_IsException(result_promise))
        goto fail;
    s = JS_GetOpaque(executor, JS_CLASS_C_FUNCTION_DATA);
    for(i = 0; i < 2; i++) {
        if (check_function(ctx, s->data[i]))
            goto fail;
    }
    for(i = 0; i < 2; i++)
        resolving_funcs[i] = JS_DupValue(ctx, s->data[i]);
    JS_FreeValue(ctx, executor);
    return result_promise;
 fail:
    JS_FreeValue(ctx, executor);
    JS_FreeValue(ctx, result_promise);
    return JS_EXCEPTION;
}